

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O1

Var Js::GlobalObject::EntryCollectGarbage(RecyclableObject *function,CallInfo callInfo,...)

{
  Recycler *this;
  ScriptContext *scriptContext;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Var aValue;
  ScriptContext *pSVar4;
  double dVar5;
  int in_stack_00000010;
  undefined1 local_58 [8];
  ArgumentReader args;
  CallInfo local_38;
  CallInfo callInfo_local;
  
  pSVar4 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_38 = callInfo;
  ThreadContext::ProbeStack(pSVar4->threadContext,0xc00,pSVar4,(PVOID)0x0);
  if (DAT_015d3464 == '\x01') {
    Output::Print(L"MemoryTrace: GlobalObject::EntryCollectGarbage Invoke\n");
    Output::Flush();
  }
  if (((ulong)local_38 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x604,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) goto LAB_00b5c28e;
    *puVar3 = 0;
  }
  pSVar4 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  this = pSVar4->recycler;
  if (this != (Recycler *)0x0) {
    if (in_stack_00000010 != local_38._0_4_) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                  ,0x60c,
                                  "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)"
                                  ,"*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo"
                                 );
      if (!bVar2) goto LAB_00b5c28e;
      *puVar3 = 0;
    }
    args.super_Arguments.Info = (Type)&stack0x00000018;
    local_58 = (undefined1  [8])local_38;
    ArgumentReader::AdjustArguments((ArgumentReader *)local_58,&local_38);
    if (((ulong)local_58 & 0xfffffe) != 0) {
      args.super_Arguments.Values = (Type)pSVar4;
      aValue = Arguments::operator[]((Arguments *)local_58,1);
      scriptContext =
           (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
      if (((ulong)aValue & 0x1ffff00000000) != 0x1000000000000 &&
          ((ulong)aValue & 0xffff000000000000) == 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar2) {
LAB_00b5c28e:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
      pSVar4 = (ScriptContext *)args.super_Arguments.Values;
      if (((ulong)aValue & 0xffff000000000000) == 0x1000000000000) {
        dVar5 = (double)(int)aValue;
      }
      else if ((ulong)aValue >> 0x32 == 0) {
        dVar5 = JavascriptConversion::ToNumber_Full(aValue,scriptContext);
      }
      else {
        dVar5 = (double)((ulong)aValue ^ 0xfffc000000000000);
      }
      if ((dVar5 == 1.0) && (!NAN(dVar5))) {
        this->dumpObjectOnceOnCollect = true;
      }
    }
    Memory::Recycler::CollectNow<(Memory::CollectionFlags)3221524480>(this);
  }
  if (DAT_015d3464 == '\x01') {
    Output::Print(L"MemoryTrace: GlobalObject::EntryCollectGarbage Exit\n");
    Output::Flush();
  }
  return (((pSVar4->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
         undefinedValue.ptr;
}

Assistant:

Var GlobalObject::EntryCollectGarbage(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

#if DBG_DUMP
        if (Js::Configuration::Global.flags.TraceWin8Allocations)
        {
            Output::Print(_u("MemoryTrace: GlobalObject::EntryCollectGarbage Invoke\n"));
            Output::Flush();
        }
#endif

#if DBG
        // Clear 1K of stack to avoid false positive in debug build.
        // Because we don't debug build don't stack pack
        DebugClearStack();
#endif
        Assert(!(callInfo.Flags & CallFlags_New));

        ScriptContext* scriptContext = function->GetScriptContext();

        Recycler* recycler = scriptContext->GetRecycler();
        if (recycler)
        {
#if DBG && defined(RECYCLER_DUMP_OBJECT_GRAPH)
            ARGUMENTS(args, callInfo);
            if (args.Info.Count > 1)
            {
                double value = JavascriptConversion::ToNumber(args[1], function->GetScriptContext());
                if (value == 1.0)
                {
                    recycler->dumpObjectOnceOnCollect = true;
                }
            }
#endif
            recycler->CollectNow<CollectNowDecommitNowExplicit>();
        }

#if DBG_DUMP
        if (Js::Configuration::Global.flags.TraceWin8Allocations)
        {
            Output::Print(_u("MemoryTrace: GlobalObject::EntryCollectGarbage Exit\n"));
            Output::Flush();
        }
#endif

        return scriptContext->GetLibrary()->GetUndefined();
    }